

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O2

void __thiscall
Memory::LargeHeapBucket::ScanInitialImplicitRoots(LargeHeapBucket *this,Recycler *recycler)

{
  LargeHeapBlock *pLVar1;
  undefined4 *puVar2;
  code *pcVar3;
  bool bVar4;
  LargeHeapBlock **ppLVar5;
  undefined8 *in_FS_OFFSET;
  
  ppLVar5 = &this->largeBlockList;
  while (pLVar1 = *ppLVar5, pLVar1 != (LargeHeapBlock *)0x0) {
    LargeHeapBlock::ScanInitialImplicitRoots(pLVar1,recycler);
    ppLVar5 = &pLVar1->next;
  }
  ppLVar5 = &this->largePageHeapBlockList;
  while (pLVar1 = *ppLVar5, pLVar1 != (LargeHeapBlock *)0x0) {
    LargeHeapBlock::ScanInitialImplicitRoots(pLVar1,recycler);
    ppLVar5 = &pLVar1->next;
  }
  ppLVar5 = &this->fullLargeBlockList;
  while (pLVar1 = *ppLVar5, pLVar1 != (LargeHeapBlock *)0x0) {
    LargeHeapBlock::ScanInitialImplicitRoots(pLVar1,recycler);
    ppLVar5 = &pLVar1->next;
  }
  ppLVar5 = &this->pendingDisposeLargeBlockList;
  while (pLVar1 = *ppLVar5, pLVar1 != (LargeHeapBlock *)0x0) {
    LargeHeapBlock::ScanInitialImplicitRoots(pLVar1,recycler);
    ppLVar5 = &pLVar1->next;
  }
  if (this->pendingSweepLargeBlockList != (LargeHeapBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x226,"(pendingSweepLargeBlockList == nullptr)",
                       "pendingSweepLargeBlockList == nullptr");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar2 = 0;
  }
  return;
}

Assistant:

void
LargeHeapBucket::ScanInitialImplicitRoots(Recycler * recycler)
{
    HeapBlockList::ForEach(largeBlockList, [recycler](LargeHeapBlock * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });
#ifdef RECYCLER_PAGE_HEAP
    HeapBlockList::ForEach(largePageHeapBlockList, [recycler](LargeHeapBlock * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });
#endif
    HeapBlockList::ForEach(fullLargeBlockList, [recycler](LargeHeapBlock * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });
    HeapBlockList::ForEach(pendingDisposeLargeBlockList, [recycler](LargeHeapBlock * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });
#if ENABLE_CONCURRENT_GC
    Assert(pendingSweepLargeBlockList == nullptr);
#endif
}